

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O3

void __thiscall
TEST_MockComparatorCopierTest_customTypeOutputParameterSucceeds_Test::testBody
          (TEST_MockComparatorCopierTest_customTypeOutputParameterSucceeds_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  char *pcVar5;
  char *pcVar6;
  SimpleString SStack_88;
  SimpleString local_78;
  MyTypeForTesting actualObject;
  MyTypeForTesting expectedObject;
  SimpleString local_48;
  SimpleString local_38;
  MyTypeForTestingCopier copier;
  
  expectedObject._vptr_MyTypeForTesting = (_func_int **)&PTR__MyTypeForTesting_002b2490;
  expectedObject.value =
       (long *)operator_new(8,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                            ,0x2e);
  *expectedObject.value = 0x37;
  actualObject._vptr_MyTypeForTesting = (_func_int **)&PTR__MyTypeForTesting_002b2490;
  actualObject.value =
       (long *)operator_new(8,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                            ,0x2e);
  *actualObject.value = 99;
  copier.super_MockNamedValueCopier._vptr_MockNamedValueCopier =
       (MockNamedValueCopier)&PTR__MockNamedValueCopier_002b2ca8;
  SimpleString::SimpleString(&SStack_88,"");
  pMVar2 = mock(&SStack_88,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_78,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2d])(pMVar2,&local_78,&copier);
  SimpleString::~SimpleString(&local_78);
  SimpleString::~SimpleString(&SStack_88);
  SimpleString::SimpleString(&SStack_88,"");
  pMVar2 = mock(&SStack_88,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_78,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_78);
  SimpleString::SimpleString(&local_38,"MyTypeForTesting");
  SimpleString::SimpleString(&local_48,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))
            ((long *)CONCAT44(extraout_var,iVar1),&local_38,&local_48,&expectedObject);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_78);
  SimpleString::~SimpleString(&SStack_88);
  SimpleString::SimpleString(&SStack_88,"");
  pMVar2 = mock(&SStack_88,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_78,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_78);
  SimpleString::SimpleString(&local_38,"MyTypeForTesting");
  SimpleString::SimpleString(&local_48,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x30))
            ((long *)CONCAT44(extraout_var_00,iVar1),&local_38,&local_48,&actualObject);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_78);
  SimpleString::~SimpleString(&SStack_88);
  SimpleString::SimpleString(&SStack_88,"");
  pMVar2 = mock(&SStack_88,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&SStack_88);
  if (*expectedObject.value == 0x37) {
    pUVar3 = UtestShell::getCurrent();
    pTVar4 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0xad,pTVar4);
  }
  else {
    pUVar3 = UtestShell::getCurrent();
    ::StringFrom((int)&SStack_88);
    pcVar5 = SimpleString::asCharString(&SStack_88);
    ::StringFrom((long)&local_78);
    pcVar6 = SimpleString::asCharString(&local_78);
    pTVar4 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0xad,pTVar4);
    SimpleString::~SimpleString(&local_78);
    SimpleString::~SimpleString(&SStack_88);
  }
  if (*actualObject.value == 0x37) {
    pUVar3 = UtestShell::getCurrent();
    pTVar4 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0xae,pTVar4);
  }
  else {
    pUVar3 = UtestShell::getCurrent();
    ::StringFrom((int)&SStack_88);
    pcVar5 = SimpleString::asCharString(&SStack_88);
    ::StringFrom((long)&local_78);
    pcVar6 = SimpleString::asCharString(&local_78);
    pTVar4 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0xae,pTVar4);
    SimpleString::~SimpleString(&local_78);
    SimpleString::~SimpleString(&SStack_88);
  }
  SimpleString::SimpleString(&SStack_88,"");
  pMVar2 = mock(&SStack_88,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x2f])(pMVar2);
  SimpleString::~SimpleString(&SStack_88);
  actualObject._vptr_MyTypeForTesting = (_func_int **)&PTR__MyTypeForTesting_002b2490;
  operator_delete(actualObject.value,8);
  expectedObject._vptr_MyTypeForTesting = (_func_int **)&PTR__MyTypeForTesting_002b2490;
  operator_delete(expectedObject.value,8);
  return;
}

Assistant:

MyTypeForTesting(long val)
    {
        value = new long(val);
    }